

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlcatalog.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  FILE *pFVar3;
  FILE *out_1;
  xmlChar *ans;
  xmlURIPtr uri;
  FILE *out;
  xmlCatalogPtr super;
  xmlCatalogPtr catal;
  int local_20;
  int exit_value;
  int ret;
  int i;
  char **argv_local;
  int argc_local;
  
  catal._4_4_ = 0;
  if (argc < 2) {
    usage(*argv);
    argv_local._4_4_ = 1;
  }
  else {
    xmlCheckVersion(0x526c);
    exit_value = 1;
    while (((exit_value < argc && (iVar1 = strcmp(argv[exit_value],"-"), iVar1 != 0)) &&
           (*argv[exit_value] == '-'))) {
      iVar1 = strcmp(argv[exit_value],"-verbose");
      if (((iVar1 == 0) || (iVar1 = strcmp(argv[exit_value],"-v"), iVar1 == 0)) ||
         (iVar1 = strcmp(argv[exit_value],"--verbose"), iVar1 == 0)) {
        verbose = verbose + 1;
        xmlCatalogSetDebug(verbose);
      }
      else {
        iVar1 = strcmp(argv[exit_value],"-noout");
        if ((iVar1 == 0) || (iVar1 = strcmp(argv[exit_value],"--noout"), iVar1 == 0)) {
          noout = 1;
        }
        else {
          iVar1 = strcmp(argv[exit_value],"-shell");
          if ((iVar1 == 0) || (iVar1 = strcmp(argv[exit_value],"--shell"), iVar1 == 0)) {
            shell = shell + 1;
            noout = 1;
          }
          else {
            iVar1 = strcmp(argv[exit_value],"-sgml");
            if ((iVar1 == 0) || (iVar1 = strcmp(argv[exit_value],"--sgml"), iVar1 == 0)) {
              sgml = sgml + 1;
            }
            else {
              iVar1 = strcmp(argv[exit_value],"-create");
              if ((iVar1 == 0) || (iVar1 = strcmp(argv[exit_value],"--create"), iVar1 == 0)) {
                create = create + 1;
              }
              else {
                iVar1 = strcmp(argv[exit_value],"-convert");
                if ((iVar1 == 0) || (iVar1 = strcmp(argv[exit_value],"--convert"), iVar1 == 0)) {
                  convert = convert + 1;
                }
                else {
                  iVar1 = strcmp(argv[exit_value],"-no-super-update");
                  if ((iVar1 == 0) ||
                     (iVar1 = strcmp(argv[exit_value],"--no-super-update"), iVar1 == 0)) {
                    no_super_update = no_super_update + 1;
                  }
                  else {
                    iVar1 = strcmp(argv[exit_value],"-add");
                    if ((iVar1 == 0) || (iVar1 = strcmp(argv[exit_value],"--add"), iVar1 == 0)) {
                      if (sgml == 0) {
                        exit_value = exit_value + 3;
                      }
                      else {
                        exit_value = exit_value + 2;
                      }
                      add = add + 1;
                    }
                    else {
                      iVar1 = strcmp(argv[exit_value],"-del");
                      if ((iVar1 != 0) && (iVar1 = strcmp(argv[exit_value],"--del"), iVar1 != 0)) {
                        fprintf(_stderr,"Unknown option %s\n",argv[exit_value]);
                        usage(*argv);
                        return 1;
                      }
                      exit_value = exit_value + 1;
                      del = del + 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
      exit_value = exit_value + 1;
    }
    for (exit_value = 1; exit_value < argc; exit_value = exit_value + 1) {
      iVar1 = strcmp(argv[exit_value],"-add");
      if ((iVar1 == 0) || (iVar1 = strcmp(argv[exit_value],"--add"), iVar1 == 0)) {
        if (sgml == 0) {
          iVar1 = exit_value + 3;
        }
        else {
          iVar1 = exit_value + 2;
        }
      }
      else {
        iVar1 = strcmp(argv[exit_value],"-del");
        if ((iVar1 == 0) || (iVar1 = strcmp(argv[exit_value],"--del"), iVar1 == 0)) {
          iVar1 = exit_value + 1;
          if ((iVar1 == argc) || ((sgml != 0 && (exit_value + 2 == argc)))) {
            fprintf(_stderr,"No catalog entry specified to remove from\n");
            usage(*argv);
            return 1;
          }
        }
        else {
          iVar1 = exit_value;
          if (*argv[exit_value] != '-') {
            if ((filename == (char *)0x0) && (*argv[exit_value] == '\0')) {
              xmlInitializeCatalog();
            }
            else {
              filename = argv[exit_value];
              iVar1 = xmlLoadCatalog(argv[exit_value]);
              if ((iVar1 < 0) && (create != 0)) {
                xmlCatalogAdd("catalog",argv[exit_value],0);
              }
            }
            break;
          }
        }
      }
      exit_value = iVar1;
    }
    if (convert != 0) {
      xmlCatalogConvert();
    }
    if ((add == 0) && (del == 0)) {
      if (shell == 0) {
        while (exit_value = exit_value + 1, exit_value < argc) {
          lVar2 = xmlParseURI(argv[exit_value]);
          if (lVar2 == 0) {
            lVar2 = xmlCatalogResolvePublic(argv[exit_value]);
            if (lVar2 == 0) {
              printf("No entry for PUBLIC %s\n",argv[exit_value]);
              catal._4_4_ = 4;
            }
            else {
              printf("%s\n",lVar2);
              (*_xmlFree)(lVar2);
            }
          }
          else {
            xmlFreeURI(lVar2);
            lVar2 = xmlCatalogResolveSystem(argv[exit_value]);
            if (lVar2 == 0) {
              printf("No entry for SYSTEM %s\n",argv[exit_value]);
              lVar2 = xmlCatalogResolveURI(argv[exit_value]);
              if (lVar2 == 0) {
                printf("No entry for URI %s\n",argv[exit_value]);
                catal._4_4_ = 4;
              }
              else {
                printf("%s\n",lVar2);
                (*_xmlFree)(lVar2);
              }
            }
            else {
              printf("%s\n",lVar2);
              (*_xmlFree)(lVar2);
            }
          }
        }
      }
      else {
        usershell();
      }
    }
    else {
      exit_value = 1;
      while ((exit_value < argc && (iVar1 = strcmp(argv[exit_value],"-"), iVar1 != 0))) {
        if ((*argv[exit_value] == '-') &&
           ((((iVar1 = strcmp(argv[exit_value],"-add"), iVar1 == 0 ||
              (iVar1 = strcmp(argv[exit_value],"--add"), iVar1 == 0)) ||
             (iVar1 = strcmp(argv[exit_value],"-del"), iVar1 == 0)) ||
            (iVar1 = strcmp(argv[exit_value],"--del"), iVar1 == 0)))) {
          if (sgml == 0) {
            iVar1 = strcmp(argv[exit_value],"-add");
            if ((iVar1 == 0) || (iVar1 = strcmp(argv[exit_value],"--add"), iVar1 == 0)) {
              if ((argv[exit_value + 3] == (char *)0x0) || (*argv[exit_value + 3] == '\0')) {
                local_20 = xmlCatalogAdd(argv[exit_value + 1],0,argv[exit_value + 2]);
              }
              else {
                local_20 = xmlCatalogAdd(argv[exit_value + 1],argv[exit_value + 2],
                                         argv[exit_value + 3]);
              }
              if (local_20 != 0) {
                printf("add command failed\n");
                catal._4_4_ = 3;
              }
              exit_value = exit_value + 3;
            }
            else {
              iVar1 = strcmp(argv[exit_value],"-del");
              if ((iVar1 == 0) || (iVar1 = strcmp(argv[exit_value],"--del"), iVar1 == 0)) {
                iVar1 = xmlCatalogRemove(argv[exit_value + 1]);
                if (iVar1 < 0) {
                  fprintf(_stderr,"Failed to remove entry %s\n",argv[exit_value + 1]);
                  catal._4_4_ = 1;
                }
                exit_value = exit_value + 1;
              }
            }
          }
          else {
            out = (FILE *)0x0;
            super = (xmlCatalogPtr)xmlLoadSGMLSuperCatalog(argv[exit_value + 1]);
            iVar1 = strcmp(argv[exit_value],"-add");
            if ((iVar1 == 0) || (iVar1 = strcmp(argv[exit_value],"--add"), iVar1 == 0)) {
              if (super == (xmlCatalogPtr)0x0) {
                super = (xmlCatalogPtr)xmlNewCatalog(1);
              }
              xmlACatalogAdd(super,"CATALOG",argv[exit_value + 2],0);
              if (no_super_update == 0) {
                out = (FILE *)xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog");
                if (out == (FILE *)0x0) {
                  out = (FILE *)xmlNewCatalog(1);
                }
                xmlACatalogAdd(out,"CATALOG",argv[exit_value + 1],0);
              }
            }
            else {
              if (super == (xmlCatalogPtr)0x0) {
                local_20 = -1;
              }
              else {
                local_20 = xmlACatalogRemove(super,argv[exit_value + 2]);
              }
              if (local_20 < 0) {
                fprintf(_stderr,"Failed to remove entry from %s\n",argv[exit_value + 1]);
                catal._4_4_ = 1;
              }
              if ((((no_super_update == 0) && (noout != 0)) && (super != (xmlCatalogPtr)0x0)) &&
                 (((iVar1 = xmlCatalogIsEmpty(super), iVar1 != 0 &&
                   (out = (FILE *)xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog"),
                   out != (FILE *)0x0)) &&
                  (iVar1 = xmlACatalogRemove(out,argv[exit_value + 1]), iVar1 < 0)))) {
                fprintf(_stderr,"Failed to remove entry from %s\n","/usr/local/etc/sgml/catalog");
                catal._4_4_ = 1;
              }
            }
            if (noout == 0) {
              xmlACatalogDump(super,_stdout);
            }
            else {
              iVar1 = xmlCatalogIsEmpty(super);
              if (iVar1 == 0) {
                pFVar3 = fopen64(argv[exit_value + 1],"w");
                if (pFVar3 == (FILE *)0x0) {
                  fprintf(_stderr,"could not open %s for saving\n",argv[exit_value + 1]);
                  catal._4_4_ = 2;
                  noout = 0;
                }
                else {
                  xmlACatalogDump(super,pFVar3);
                  fclose(pFVar3);
                }
              }
              else {
                remove(argv[exit_value + 1]);
              }
              if ((no_super_update == 0) && (out != (FILE *)0x0)) {
                iVar1 = xmlCatalogIsEmpty(out);
                if (iVar1 == 0) {
                  pFVar3 = fopen64("/usr/local/etc/sgml/catalog","w");
                  if (pFVar3 == (FILE *)0x0) {
                    fprintf(_stderr,"could not open %s for saving\n","/usr/local/etc/sgml/catalog");
                    catal._4_4_ = 2;
                    noout = 0;
                  }
                  else {
                    xmlACatalogDump(out,pFVar3);
                    fclose(pFVar3);
                  }
                }
                else {
                  remove("/usr/local/etc/sgml/catalog");
                }
              }
            }
            exit_value = exit_value + 2;
          }
        }
        exit_value = exit_value + 1;
      }
    }
    if ((sgml == 0) && ((((add != 0 || (del != 0)) || (create != 0)) || (convert != 0)))) {
      if (((noout == 0) || (filename == (char *)0x0)) || (*filename == '\0')) {
        xmlCatalogDump(_stdout);
      }
      else {
        pFVar3 = fopen64(filename,"w");
        if (pFVar3 == (FILE *)0x0) {
          fprintf(_stderr,"could not open %s for saving\n",filename);
          catal._4_4_ = 2;
          noout = 0;
        }
        else {
          xmlCatalogDump(pFVar3);
        }
      }
    }
    xmlCleanupParser();
    xmlMemoryDump();
    argv_local._4_4_ = catal._4_4_;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int ret;
    int exit_value = 0;


    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }

    LIBXML_TEST_VERSION
    for (i = 1; i < argc ; i++) {
	if (!strcmp(argv[i], "-"))
	    break;

	if (argv[i][0] != '-')
	    break;
	if ((!strcmp(argv[i], "-verbose")) ||
	    (!strcmp(argv[i], "-v")) ||
	    (!strcmp(argv[i], "--verbose"))) {
	    verbose++;
	    xmlCatalogSetDebug(verbose);
	} else if ((!strcmp(argv[i], "-noout")) ||
	    (!strcmp(argv[i], "--noout"))) {
            noout = 1;
	} else if ((!strcmp(argv[i], "-shell")) ||
	    (!strcmp(argv[i], "--shell"))) {
	    shell++;
            noout = 1;
	} else if ((!strcmp(argv[i], "-sgml")) ||
	    (!strcmp(argv[i], "--sgml"))) {
	    sgml++;
	} else if ((!strcmp(argv[i], "-create")) ||
	    (!strcmp(argv[i], "--create"))) {
	    create++;
	} else if ((!strcmp(argv[i], "-convert")) ||
	    (!strcmp(argv[i], "--convert"))) {
	    convert++;
	} else if ((!strcmp(argv[i], "-no-super-update")) ||
	    (!strcmp(argv[i], "--no-super-update"))) {
	    no_super_update++;
	} else if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    add++;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;
	    del++;
	} else {
	    fprintf(stderr, "Unknown option %s\n", argv[i]);
	    usage(argv[0]);
	    return(1);
	}
    }

    for (i = 1; i < argc; i++) {
	if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    continue;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;

	    /* No catalog entry specified */
	    if (i == argc || (sgml && i + 1 == argc)) {
		fprintf(stderr, "No catalog entry specified to remove from\n");
		usage (argv[0]);
		return(1);
	    }

	    continue;
	} else if (argv[i][0] == '-')
	    continue;

	if (filename == NULL && argv[i][0] == '\0') {
	    /* Interpret empty-string catalog specification as
	       a shortcut for a default system catalog. */
	    xmlInitializeCatalog();
	} else {
	    filename = argv[i];
	    ret = xmlLoadCatalog(argv[i]);
	    if ((ret < 0) && (create)) {
		xmlCatalogAdd(BAD_CAST "catalog", BAD_CAST argv[i], NULL);
	    }
	}
	break;
    }

    if (convert)
        ret = xmlCatalogConvert();

    if ((add) || (del)) {
	for (i = 1; i < argc ; i++) {
	    if (!strcmp(argv[i], "-"))
		break;

	    if (argv[i][0] != '-')
		continue;
	    if (strcmp(argv[i], "-add") && strcmp(argv[i], "--add") &&
		strcmp(argv[i], "-del") && strcmp(argv[i], "--del"))
		continue;

	    if (sgml) {
		/*
		 * Maintenance of SGML catalogs.
		 */
		xmlCatalogPtr catal = NULL;
		xmlCatalogPtr super = NULL;

		catal = xmlLoadSGMLSuperCatalog(argv[i + 1]);

		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
		    if (catal == NULL)
			catal = xmlNewCatalog(1);
		    xmlACatalogAdd(catal, BAD_CAST "CATALOG",
					 BAD_CAST argv[i + 2], NULL);

		    if (!no_super_update) {
			super = xmlLoadSGMLSuperCatalog(XML_SGML_DEFAULT_CATALOG);
			if (super == NULL)
			    super = xmlNewCatalog(1);

			xmlACatalogAdd(super, BAD_CAST "CATALOG",
					     BAD_CAST argv[i + 1], NULL);
		    }
		} else {
		    if (catal != NULL)
			ret = xmlACatalogRemove(catal, BAD_CAST argv[i + 2]);
		    else
			ret = -1;
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry from %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    if ((!no_super_update) && (noout) && (catal != NULL) &&
			(xmlCatalogIsEmpty(catal))) {
			super = xmlLoadSGMLSuperCatalog(
				   XML_SGML_DEFAULT_CATALOG);
			if (super != NULL) {
			    ret = xmlACatalogRemove(super,
				    BAD_CAST argv[i + 1]);
			    if (ret < 0) {
				fprintf(stderr,
					"Failed to remove entry from %s\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 1;
			    }
			}
		    }
		}
		if (noout) {
		    FILE *out;

		    if (xmlCatalogIsEmpty(catal)) {
			remove(argv[i + 1]);
		    } else {
			out = fopen(argv[i + 1], "w");
			if (out == NULL) {
			    fprintf(stderr, "could not open %s for saving\n",
				    argv[i + 1]);
			    exit_value = 2;
			    noout = 0;
			} else {
			    xmlACatalogDump(catal, out);
			    fclose(out);
			}
		    }
		    if (!no_super_update && super != NULL) {
			if (xmlCatalogIsEmpty(super)) {
			    remove(XML_SGML_DEFAULT_CATALOG);
			} else {
			    out = fopen(XML_SGML_DEFAULT_CATALOG, "w");
			    if (out == NULL) {
				fprintf(stderr,
					"could not open %s for saving\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 2;
				noout = 0;
			    } else {

				xmlACatalogDump(super, out);
				fclose(out);
			    }
			}
		    }
		} else {
		    xmlACatalogDump(catal, stdout);
		}
		i += 2;
	    } else {
		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
			if ((argv[i + 3] == NULL) || (argv[i + 3][0] == 0))
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1], NULL,
						BAD_CAST argv[i + 2]);
			else
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1],
						BAD_CAST argv[i + 2],
						BAD_CAST argv[i + 3]);
			if (ret != 0) {
			    printf("add command failed\n");
			    exit_value = 3;
			}
			i += 3;
		} else if ((!strcmp(argv[i], "-del")) ||
		    (!strcmp(argv[i], "--del"))) {
		    ret = xmlCatalogRemove(BAD_CAST argv[i + 1]);
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    i += 1;
		}
	    }
	}

    } else if (shell) {
	usershell();
    } else {
	for (i++; i < argc; i++) {
	    xmlURIPtr uri;
	    xmlChar *ans;

	    uri = xmlParseURI(argv[i]);
	    if (uri == NULL) {
		ans = xmlCatalogResolvePublic((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for PUBLIC %s\n", argv[i]);
		    exit_value = 4;
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    } else {
                xmlFreeURI(uri);
		ans = xmlCatalogResolveSystem((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for SYSTEM %s\n", argv[i]);
		    ans = xmlCatalogResolveURI ((const xmlChar *) argv[i]);
		    if (ans == NULL) {
			printf ("No entry for URI %s\n", argv[i]);
		        exit_value = 4;
		    } else {
		        printf("%s\n", (char *) ans);
			xmlFree (ans);
		    }
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    }
	}
    }
    if ((!sgml) && ((add) || (del) || (create) || (convert))) {
	if (noout && filename && *filename) {
	    FILE *out;

	    out = fopen(filename, "w");
	    if (out == NULL) {
		fprintf(stderr, "could not open %s for saving\n", filename);
		exit_value = 2;
		noout = 0;
	    } else {
		xmlCatalogDump(out);
	    }
	} else {
	    xmlCatalogDump(stdout);
	}
    }

    /*
     * Cleanup and check for memory leaks
     */
    xmlCleanupParser();
    xmlMemoryDump();
    return(exit_value);
}